

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  wchar_t wVar9;
  long lVar10;
  char *digits;
  char *pcVar11;
  char *pcVar12;
  char acStack_39 [25];
  char buffer [18];
  
  pwVar5 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar9 = it->blackhole_;
  pcVar11 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar11 = "0123456789abcdef";
  }
  iVar1 = *(int *)(this + 8);
  lVar8 = (long)iVar1;
  pcVar12 = acStack_39 + lVar8;
  uVar7 = *(ulong *)(*(long *)this + 0x10);
  do {
    *pcVar12 = pcVar11[(uint)uVar7 & 0xf];
    pcVar12 = pcVar12 + -1;
    bVar3 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar3);
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      wVar4 = (int)acStack_39[lVar10 + 1];
      if (sVar6 + lVar10 < uVar2) {
        *pwVar5 = (int)acStack_39[lVar10 + 1];
        pwVar5 = pwVar5 + 1;
        wVar4 = wVar9;
      }
      wVar9 = wVar4;
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
    sVar6 = sVar6 + lVar8;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar5;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar6;
  it->blackhole_ = wVar9;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }